

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

int tlstran_pipe_init(void *arg,nni_pipe *npipe)

{
  tlstran_pipe *p;
  nni_pipe *npipe_local;
  void *arg_local;
  
  *(nni_pipe **)((long)arg + 8) = npipe;
  nni_mtx_init((nni_mtx *)((long)arg + 0x600));
  nni_aio_init((nni_aio *)((long)arg + 0xa0),tlstran_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x268),tlstran_pipe_recv_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x430),tlstran_pipe_nego_cb,arg);
  nni_aio_list_init((nni_list *)((long)arg + 0x50));
  nni_aio_list_init((nni_list *)((long)arg + 0x38));
  return 0;
}

Assistant:

static int
tlstran_pipe_init(void *arg, nni_pipe *npipe)
{
	tlstran_pipe *p = arg;
	p->npipe        = npipe;
	nni_mtx_init(&p->mtx);
	nni_aio_init(&p->txaio, tlstran_pipe_send_cb, p);
	nni_aio_init(&p->rxaio, tlstran_pipe_recv_cb, p);
	nni_aio_init(&p->negoaio, tlstran_pipe_nego_cb, p);
	nni_aio_list_init(&p->recvq);
	nni_aio_list_init(&p->sendq);

	return (0);
}